

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

bool __thiscall ExecutorRegVm::AddBreakpoint(ExecutorRegVm *this,uint instruction,bool oneHit)

{
  uint uVar1;
  RegVmCmd in_RAX;
  RegVmCmd *pRVar2;
  char *src;
  char *dst;
  RegVmCmd local_38;
  
  if (instruction < (this->exLinker->exRegVmCode).count) {
    uVar1 = (this->breakCode).count;
    local_38 = in_RAX;
    pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                       (&this->exLinker->exRegVmCode,instruction);
    if (pRVar2->code != '\0') {
      pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                         (&this->exLinker->exRegVmCode,instruction);
      FastVector<RegVmCmd,_false,_false>::push_back(&this->breakCode,pRVar2);
      if (oneHit) {
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                           (&this->exLinker->exRegVmCode,instruction);
        pRVar2->code = '\0';
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                           (&this->exLinker->exRegVmCode,instruction);
        pRVar2->rB = '\x02';
      }
      else {
        local_38.argument = instruction + 1;
        local_38.code = '\0';
        local_38.rA = '\0';
        local_38.rB = '\x01';
        local_38.rC = '\0';
        FastVector<RegVmCmd,_false,_false>::push_back(&this->breakCode,&local_38);
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                           (&this->exLinker->exRegVmCode,instruction);
        pRVar2->code = '\0';
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                           (&this->exLinker->exRegVmCode,instruction);
        pRVar2->rB = '\0';
      }
      pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[]
                         (&this->exLinker->exRegVmCode,instruction);
      pRVar2->argument = uVar1;
      return true;
    }
    dst = this->execErrorBuffer;
    src = "ERROR: cannot set breakpoint on breakpoint";
  }
  else {
    dst = this->execErrorBuffer;
    src = "ERROR: break position out of code range";
  }
  NULLC::SafeSprintf(dst,0x10000,src);
  this->execErrorMessage = this->execErrorBuffer;
  return false;
}

Assistant:

bool ExecutorRegVm::AddBreakpoint(unsigned instruction, bool oneHit)
{
	if(instruction >= exLinker->exRegVmCode.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	unsigned pos = breakCode.size();

	if(exLinker->exRegVmCode[instruction].code == rviNop)
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: cannot set breakpoint on breakpoint");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	if(oneHit)
	{
		breakCode.push_back(exLinker->exRegVmCode[instruction]);
		exLinker->exRegVmCode[instruction].code = rviNop;
		exLinker->exRegVmCode[instruction].rB = EXEC_BREAK_ONCE;
		exLinker->exRegVmCode[instruction].argument = pos;
	}
	else
	{
		breakCode.push_back(exLinker->exRegVmCode[instruction]);
		breakCode.push_back(RegVmCmd(rviNop, 0, EXEC_BREAK_RETURN, 0, instruction + 1));

		exLinker->exRegVmCode[instruction].code = rviNop;
		exLinker->exRegVmCode[instruction].rB = EXEC_BREAK_SIGNAL;
		exLinker->exRegVmCode[instruction].argument = pos;
	}
	return true;
}